

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

long testCreateQuoteRequest(int count)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  allocator<char> local_4f1;
  int local_4f0;
  int local_4ec;
  long local_4e8;
  STRING local_4e0;
  OrderQty orderQty;
  Side side;
  StrikePrice strikePrice;
  PutOrCall putOrCall;
  MaturityMonthYear maturityMonthYear;
  Symbol symbol;
  OrdType ordType;
  Currency currency;
  NoRelatedSym noRelatedSym;
  QuoteRequest massQuote;
  
  lVar1 = GetTickCount();
  FIX::Symbol::Symbol(&symbol);
  FIX::MaturityMonthYear::MaturityMonthYear(&maturityMonthYear);
  FIX::PutOrCall::PutOrCall(&putOrCall);
  FIX::StrikePrice::StrikePrice(&strikePrice);
  FIX::Side::Side(&side);
  FIX::OrderQty::OrderQty(&orderQty);
  FIX::Currency::Currency(&currency);
  local_4e8 = lVar1;
  FIX::OrdType::OrdType(&ordType);
  local_4ec = 0;
  if (count < 1) {
    count = 0;
  }
  local_4f0 = count;
  for (; local_4ec != local_4f0; local_4ec = local_4ec + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"1",&local_4f1);
    FIX::QuoteReqID::QuoteReqID((QuoteReqID *)&noRelatedSym.super_Group,&local_4e0);
    FIX42::QuoteRequest::QuoteRequest(&massQuote,(QuoteReqID *)&noRelatedSym.super_Group);
    FIX::FieldBase::~FieldBase((FieldBase *)&noRelatedSym.super_Group);
    std::__cxx11::string::~string((string *)&local_4e0);
    FIX42::QuoteRequest::NoRelatedSym::NoRelatedSym((NoRelatedSym *)&noRelatedSym.super_Group);
    iVar2 = 10;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"IBM",&local_4f1);
      FIX::FieldBase::setString((FieldBase *)&symbol,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"022003",&local_4f1);
      FIX::FieldBase::setString((FieldBase *)&maturityMonthYear,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      FIX::IntField::setValue(&putOrCall.super_IntField,0);
      FIX::DoubleField::setValue(&strikePrice.super_PriceField,120.0,0);
      FIX::CharField::setValue(&side.super_CharField,'1');
      FIX::DoubleField::setValue(&orderQty.super_QtyField,100.0,0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"USD",&local_4f1);
      FIX::FieldBase::setString((FieldBase *)&currency,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      FIX::CharField::setValue(&ordType.super_CharField,'1');
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&symbol);
      FIX42::QuoteRequest::NoRelatedSym::set
                ((NoRelatedSym *)&noRelatedSym.super_Group,&maturityMonthYear);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&putOrCall);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&strikePrice)
      ;
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&side);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&orderQty);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&currency);
      FIX42::QuoteRequest::NoRelatedSym::set((NoRelatedSym *)&noRelatedSym.super_Group,&ordType);
      FIX::Message::addGroup((Message *)&massQuote,&noRelatedSym.super_Group);
      FIX::FieldMap::clear();
    }
    FIX::FieldMap::~FieldMap(&noRelatedSym.super_Group.super_FieldMap);
    FIX::Message::~Message((Message *)&massQuote);
  }
  lVar1 = GetTickCount();
  lVar1 = lVar1 - local_4e8;
  FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
  FIX::FieldBase::~FieldBase((FieldBase *)&currency);
  FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
  FIX::FieldBase::~FieldBase((FieldBase *)&side);
  FIX::FieldBase::~FieldBase((FieldBase *)&strikePrice);
  FIX::FieldBase::~FieldBase((FieldBase *)&putOrCall);
  FIX::FieldBase::~FieldBase((FieldBase *)&maturityMonthYear);
  FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
  return lVar1;
}

Assistant:

long testCreateQuoteRequest(int count) {
  count = count - 1;

  long start = GetTickCount();
  FIX::Symbol symbol;
  FIX::MaturityMonthYear maturityMonthYear;
  FIX::PutOrCall putOrCall;
  FIX::StrikePrice strikePrice;
  FIX::Side side;
  FIX::OrderQty orderQty;
  FIX::Currency currency;
  FIX::OrdType ordType;

  for (int i = 0; i <= count; ++i) {
    FIX42::QuoteRequest massQuote(FIX::QuoteReqID("1"));
    FIX42::QuoteRequest::NoRelatedSym noRelatedSym;

    for (int j = 1; j <= 10; ++j) {
      symbol.setValue("IBM");
      maturityMonthYear.setValue("022003");
      putOrCall.setValue(FIX::PutOrCall_PUT);
      strikePrice.setValue(120);
      side.setValue(FIX::Side_BUY);
      orderQty.setValue(100);
      currency.setValue("USD");
      ordType.setValue(FIX::OrdType_MARKET);
      noRelatedSym.set(symbol);
      noRelatedSym.set(maturityMonthYear);
      noRelatedSym.set(putOrCall);
      noRelatedSym.set(strikePrice);
      noRelatedSym.set(side);
      noRelatedSym.set(orderQty);
      noRelatedSym.set(currency);
      noRelatedSym.set(ordType);
      massQuote.addGroup(noRelatedSym);
      noRelatedSym.clear();
    }
  }

  return GetTickCount() - start;
}